

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize<PClass>(FSerializer *arc,char *key,PClass **clst,PClass **def)

{
  FWriter *this;
  bool bVar1;
  Value *this_00;
  Ch *cc;
  char *pcVar2;
  PClass *pPVar3;
  Value *val;
  PClass **def_local;
  PClass **clst_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (def == (PClass **)0x0)) || (*clst != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*clst == (PClass *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        this = arc->w;
        pcVar2 = FName::GetChars(&((*clst)->super_PNativeStruct).super_PStruct.super_PNamedType.
                                  TypeName);
        FWriter::String(this,pcVar2);
      }
    }
  }
  else {
    this_00 = FReader::FindKey(arc->r,key);
    if (this_00 != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsString(this_00);
      if (bVar1) {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
        pcVar2 = UnicodeToString(cc);
        pPVar3 = PClass::FindClass(pcVar2);
        *clst = pPVar3;
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsNull(this_00);
        if (bVar1) {
          *clst = (PClass *)0x0;
        }
        else {
          Printf("\x1cGstring type expected for \'%s\'",key);
          *clst = (PClass *)0x0;
          arc->mErrors = arc->mErrors + 1;
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, PClass *&clst, PClass **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || clst != *def)
		{
			arc.WriteKey(key);
			if (clst == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(clst->TypeName.GetChars());
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsString())
			{
				clst = PClass::FindClass(UnicodeToString(val->GetString()));
			}
			else if (val->IsNull())
			{
				clst = nullptr;
			}
			else
			{
				Printf(TEXTCOLOR_RED "string type expected for '%s'", key);
				clst = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;

}